

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

bool CGL::SceneObjects::is_valid_intersection(Vector3D *t_b1_b2,Ray *r)

{
  double dVar1;
  double dVar2;
  double b2;
  double b1;
  double t;
  Ray *r_local;
  Vector3D *t_b1_b2_local;
  bool local_1;
  
  dVar1 = (t_b1_b2->field_0).field_0.x;
  if ((dVar1 < r->min_t) || (r->max_t < dVar1)) {
    local_1 = false;
  }
  else {
    dVar1 = (t_b1_b2->field_0).field_0.y;
    dVar2 = (t_b1_b2->field_0).field_0.z;
    if ((dVar1 < 0.0) || (1.0 < dVar1)) {
      local_1 = false;
    }
    else if ((dVar2 < 0.0) || (1.0 < dVar2)) {
      local_1 = false;
    }
    else if (dVar1 + dVar2 <= 1.0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool is_valid_intersection(Vector3D &t_b1_b2, const Ray &r) {
    double t = t_b1_b2.x;

    if (t < r.min_t || t > r.max_t) {
        return false;
    }

    double b1 = t_b1_b2.y;
    double b2 = t_b1_b2.z;

    if (b1 < 0 || b1 > 1) {
        return false;
    } else if (b2 < 0 || b2 > 1) {
        return false;
    }

    // at this point, we know 0 <= b1 <= 1 and 0 <= b2 <= 1
    // now need to test validity of b0
    if (b1 + b2 > 1) {
        return false;
    }

    return true;
}